

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

void BailOutRecord::SetHasBailedOutBit(BailOutRecord *bailOutRecord,ScriptContext *scriptContext)

{
  bool *pbVar1;
  code *pcVar2;
  bool bVar3;
  EHBailoutData *pEVar4;
  undefined4 *puVar5;
  
  pEVar4 = bailOutRecord->ehBailoutData;
  if (pEVar4 != (EHBailoutData *)0x0) {
    while (pEVar4->ht == HT_Finally) {
      pEVar4 = pEVar4->parent;
      if (pEVar4 == (EHBailoutData *)0x0) {
        return;
      }
      if (pEVar4->nestingDepth < 0) {
        return;
      }
    }
    pbVar1 = scriptContext->threadContext->hasBailedOutBitPtr;
    if (pbVar1 == (bool *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x4f1,"(hasBailedOutBitPtr)","hasBailedOutBitPtr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    *pbVar1 = true;
  }
  return;
}

Assistant:

void
BailOutRecord::SetHasBailedOutBit(BailOutRecord const * bailOutRecord, Js::ScriptContext * scriptContext)
{
    Js::EHBailoutData * ehBailoutData = bailOutRecord->ehBailoutData;
    if (!ehBailoutData)
    {
        return;
    }

    // When a bailout occurs within a finally region, the hasBailedOutBitPtr associated with the
    // try-catch-finally or try-finally has already been removed from the stack. In that case,
    // we set the hasBailedOutBitPtr for the nearest enclosing try or catch region within the
    // function.
    while (ehBailoutData->ht == Js::HandlerType::HT_Finally)
    {
        if (!ehBailoutData->parent || ehBailoutData->parent->nestingDepth < 0)
        {
            return;
        }
        ehBailoutData = ehBailoutData->parent;
    }

    bool * hasBailedOutBitPtr = scriptContext->GetThreadContext()->GetHasBailedOutBitPtr();
    Assert(hasBailedOutBitPtr);
    *hasBailedOutBitPtr = true;
}